

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O1

void __thiscall wabt::interp::Istream::EmitInternal<v128>(Istream *this,v128 val)

{
  pointer puVar1;
  ulong __new_size;
  ulong uVar2;
  
  uVar2 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  __new_size = (ulong)((int)uVar2 + 0x10);
  if (uVar2 < __new_size) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data_,__new_size);
  }
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(long *)(puVar1 + (uVar2 & 0xffffffff)) = val.v._0_8_;
  *(long *)(puVar1 + (uVar2 & 0xffffffff) + 8) = val.v._8_8_;
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}